

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_build_tls12_export_params
              (ptls_context_t *ctx,ptls_buffer_t *output,int is_server,int session_reused,
              ptls_cipher_suite_t *cipher,void *master_secret,void *hello_randoms,
              uint64_t next_send_record_iv,char *server_name,ptls_iovec_t negotiated_protocol)

{
  ptls_aead_algorithm_t *ppVar1;
  size_t sVar2;
  ulong outlen;
  uint8_t *dec_key;
  ptls_iovec_t seed;
  uint8_t *output_00;
  int iVar3;
  uint8_t *dec_iv;
  uint8_t *enc_iv;
  ptls_iovec_t secret;
  uint8_t key_block [128];
  
  ppVar1 = cipher->aead;
  sVar2 = (ppVar1->tls12).fixed_iv_size;
  if ((ppVar1->tls12).record_iv_size + sVar2 == 0) {
    __assert_fail("cipher->aead->tls12.fixed_iv_size + cipher->aead->tls12.record_iv_size != 0 || !\"given cipher-suite supports TLS/1.2\""
                  ,"/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x147a,
                  "int ptls_build_tls12_export_params(ptls_context_t *, ptls_buffer_t *, int, int, ptls_cipher_suite_t *, const void *, const void *, uint64_t, const char *, ptls_iovec_t)"
                 );
  }
  outlen = (sVar2 + ppVar1->key_size) * 2;
  if (0x80 < outlen) {
    __assert_fail("key_block_len <= sizeof(key_block)",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x1480,
                  "int ptls_build_tls12_export_params(ptls_context_t *, ptls_buffer_t *, int, int, ptls_cipher_suite_t *, const void *, const void *, uint64_t, const char *, ptls_iovec_t)"
                 );
  }
  output_00 = key_block;
  seed.len = 0x40;
  seed.base = (uint8_t *)hello_randoms;
  secret.len = 0x30;
  secret.base = (uint8_t *)master_secret;
  iVar3 = ptls_tls12_phash(cipher->hash,output_00,outlen,secret,"key expansion",seed);
  if (iVar3 == 0) {
    sVar2 = cipher->aead->key_size;
    enc_iv = key_block + sVar2 * 2;
    dec_iv = enc_iv + (cipher->aead->tls12).fixed_iv_size;
    dec_key = key_block + sVar2;
    if (is_server != 0) {
      dec_iv = enc_iv;
      enc_iv = enc_iv + (cipher->aead->tls12).fixed_iv_size;
      dec_key = output_00;
      output_00 = key_block + sVar2;
    }
    iVar3 = export_tls12_params(output,is_server,session_reused,cipher,
                                (void *)((long)hello_randoms + 0x20),server_name,negotiated_protocol
                                ,output_00,enc_iv,1,next_send_record_iv,dec_key,dec_iv,1);
  }
  (*ptls_clear_memory)(key_block,0x80);
  return iVar3;
}

Assistant:

int ptls_build_tls12_export_params(ptls_context_t *ctx, ptls_buffer_t *output, int is_server, int session_reused,
                                   ptls_cipher_suite_t *cipher, const void *master_secret, const void *hello_randoms,
                                   uint64_t next_send_record_iv, const char *server_name, ptls_iovec_t negotiated_protocol)
{
    assert(cipher->aead->tls12.fixed_iv_size + cipher->aead->tls12.record_iv_size != 0 || !"given cipher-suite supports TLS/1.2");

    uint8_t key_block[(PTLS_MAX_SECRET_SIZE + PTLS_MAX_IV_SIZE) * 2];
    size_t key_block_len = (cipher->aead->key_size + cipher->aead->tls12.fixed_iv_size) * 2;
    int ret;

    assert(key_block_len <= sizeof(key_block));

    /* generate key block */
    if ((ret =
             ptls_tls12_phash(cipher->hash, key_block, key_block_len, ptls_iovec_init(master_secret, PTLS_TLS12_MASTER_SECRET_SIZE),
                              "key expansion", ptls_iovec_init(hello_randoms, PTLS_HELLO_RANDOM_SIZE * 2))) != 0)
        goto Exit;

    /* determine key locations */
    struct {
        const void *key;
        const void *iv;
    } client_secret, server_secret, *enc_secret = is_server ? &server_secret : &client_secret,
                                    *dec_secret = is_server ? &client_secret : &server_secret;
    client_secret.key = key_block;
    server_secret.key = key_block + cipher->aead->key_size;
    client_secret.iv = key_block + cipher->aead->key_size * 2;
    server_secret.iv = key_block + cipher->aead->key_size * 2 + cipher->aead->tls12.fixed_iv_size;

    /* Serialize prams. Sequence number of the first application record is 1, because Finished is the only message sent after
     * ChangeCipherSpec. */
    ret = export_tls12_params(output, is_server, session_reused, cipher, (uint8_t *)hello_randoms + PTLS_HELLO_RANDOM_SIZE,
                              server_name, negotiated_protocol, enc_secret->key, enc_secret->iv, 1, next_send_record_iv,
                              dec_secret->key, dec_secret->iv, 1);

Exit:
    ptls_clear_memory(key_block, sizeof(key_block));
    return ret;
}